

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

void __thiscall
AVSInterface::AVSWrapper<LegacyMiniDeen>::Initialize(AVSWrapper<LegacyMiniDeen> *this)

{
  DSVideoInfo in_vi;
  bool bVar1;
  int iVar2;
  AVSValue *this_00;
  IClip *pIVar3;
  undefined4 extraout_var;
  AVSFetchFrameFunctor *this_01;
  undefined4 extraout_var_00;
  vector<Param,_std::allocator<Param>_> local_1c8;
  AVSValue local_1b0;
  undefined1 local_1a0 [8];
  AVSInDelegator argument;
  PClip local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int64_t local_e8;
  undefined8 uStack_e0;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 local_d8;
  DSFormat DStack_d0;
  undefined4 uStack_b4;
  int64_t iStack_b0;
  int64_t local_a8;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  undefined4 uStack_8c;
  int64_t local_88;
  undefined1 local_70 [16];
  DSVideoInfo input_vi;
  AVSWrapper<LegacyMiniDeen> *this_local;
  VideoInfo *pVVar4;
  
  input_vi._80_8_ = this;
  DSVideoInfo::DSVideoInfo((DSVideoInfo *)(local_70 + 8));
  this_00 = AVSValue::operator[](&this->_args,0);
  bVar1 = AVSValue::IsClip(this_00);
  if (bVar1) {
    AVSValue::operator[](&this->_args,0);
    AVSValue::AsClip((AVSValue *)local_70);
    PClip::operator=(&this->clip,(PClip *)local_70);
    PClip::~PClip((PClip *)local_70);
    pIVar3 = PClip::operator->(&this->clip);
    iVar2 = (*pIVar3->_vptr_IClip[5])();
    pVVar4 = (VideoInfo *)CONCAT44(extraout_var,iVar2);
    local_108._0_4_ = pVVar4->width;
    local_108._4_4_ = pVVar4->height;
    uStack_100._0_4_ = pVVar4->fps_numerator;
    uStack_100._4_4_ = pVVar4->fps_denominator;
    local_f8._0_4_ = pVVar4->num_frames;
    local_f8._4_4_ = pVVar4->pixel_type;
    uStack_f0._0_4_ = pVVar4->audio_samples_per_second;
    uStack_f0._4_4_ = pVVar4->sample_type;
    local_e8 = pVVar4->num_audio_samples;
    uStack_e0._0_4_ = pVVar4->nchannels;
    uStack_e0._4_4_ = pVVar4->image_type;
    DSVideoInfo::DSVideoInfo((DSVideoInfo *)&local_d8,*pVVar4);
    input_vi.Audio_NSamples = local_88;
    input_vi.Frames = local_98;
    input_vi.Audio_SPS = iStack_94;
    input_vi.Audio_SType = iStack_90;
    input_vi._68_4_ = uStack_8c;
    input_vi.FPSDenom = local_a8;
    input_vi.Width = iStack_a0;
    input_vi.Height = iStack_9c;
    input_vi.Format.Planes = DStack_d0.Planes;
    input_vi._28_4_ = uStack_b4;
    input_vi.FPSNum = iStack_b0;
    input_vi.Format.SSW = DStack_d0.SSW;
    input_vi.Format.SSH = DStack_d0.SSH;
    input_vi.Format.BitsPerSample = DStack_d0.BitsPerSample;
    input_vi.Format.BytesPerSample = DStack_d0.BytesPerSample;
    local_70._8_8_ = local_d8;
    input_vi.Format.IsFamilyYUV = DStack_d0.IsFamilyYUV;
    input_vi.Format.IsFamilyRGB = DStack_d0.IsFamilyRGB;
    input_vi.Format.IsFamilyYCC = DStack_d0.IsFamilyYCC;
    input_vi.Format.IsInteger = DStack_d0.IsInteger;
    input_vi.Format.IsFloat = DStack_d0.IsFloat;
    input_vi.Format._5_3_ = DStack_d0._5_3_;
    this_01 = (AVSFetchFrameFunctor *)operator_new(0x70);
    argument._params_index_map._M_h._M_single_bucket._7_1_ = 1;
    PClip::PClip(&local_110,&this->clip);
    pIVar3 = PClip::operator->(&this->clip);
    iVar2 = (*pIVar3->_vptr_IClip[5])();
    AVSFetchFrameFunctor::AVSFetchFrameFunctor
              (this_01,&local_110,*(VideoInfo *)CONCAT44(extraout_var_00,iVar2),this->_env);
    argument._params_index_map._M_h._M_single_bucket._7_1_ = 0;
    this->functor = this_01;
    PClip::~PClip(&local_110);
  }
  AVSValue::AVSValue(&local_1b0,&this->_args);
  MiniDeen::Params(&local_1c8,&(this->data).super_MiniDeen);
  AVSInDelegator::AVSInDelegator((AVSInDelegator *)local_1a0,&local_1b0,&local_1c8);
  std::vector<Param,_std::allocator<Param>_>::~vector(&local_1c8);
  AVSValue::~AVSValue(&local_1b0);
  in_vi.Format._8_8_ = input_vi.Format._0_8_;
  in_vi.Format.IsFamilyYUV = (bool)local_70[8];
  in_vi.Format.IsFamilyRGB = (bool)local_70[9];
  in_vi.Format.IsFamilyYCC = (bool)local_70[10];
  in_vi.Format.IsInteger = (bool)local_70[0xb];
  in_vi.Format.IsFloat = (bool)local_70[0xc];
  in_vi.Format._5_3_ = local_70._13_3_;
  in_vi.Format.BitsPerSample = input_vi.Format.SSW;
  in_vi.Format.BytesPerSample = input_vi.Format.SSH;
  in_vi.Format.Planes = input_vi.Format.BitsPerSample;
  in_vi._28_4_ = input_vi.Format.BytesPerSample;
  in_vi.FPSNum = input_vi._24_8_;
  in_vi.FPSDenom = input_vi.FPSNum;
  in_vi.Width = (undefined4)input_vi.FPSDenom;
  in_vi.Height = input_vi.FPSDenom._4_4_;
  in_vi.Frames = input_vi.Width;
  in_vi.Audio_SPS = input_vi.Height;
  in_vi.Audio_SType = input_vi.Frames;
  in_vi._68_4_ = input_vi.Audio_SPS;
  in_vi.Audio_NSamples = input_vi._64_8_;
  in_vi.Audio_NChannels = (undefined4)input_vi.Audio_NSamples;
  in_vi.Field = input_vi.Audio_NSamples._4_4_;
  MiniDeen::Initialize
            (&(this->data).super_MiniDeen,(InDelegator *)local_1a0,in_vi,
             &this->functor->super_FetchFrameFunctor);
  AVSInDelegator::~AVSInDelegator((AVSInDelegator *)local_1a0);
  return;
}

Assistant:

void Initialize()
    {
      auto input_vi = DSVideoInfo();
      if (_args[0].IsClip()) {
        clip = _args[0].AsClip();
        input_vi = DSVideoInfo(clip->GetVideoInfo());
        functor = new AVSFetchFrameFunctor(clip, clip->GetVideoInfo(), _env);
      }
      auto argument = AVSInDelegator(_args, data.Params());
      data.Initialize(&argument, input_vi, functor);
    }